

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qitemselectionmodel.cpp
# Opt level: O1

int __thiscall QItemSelectionModel::qt_metacall(QItemSelectionModel *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QObject::qt_metacall((QObject *)this,_c,_id,_a);
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 0x19) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -0x19;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0x19) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,_id_00,_a);
      }
      _id_00 = _id_00 + -0x19;
    }
    if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -5;
    }
  }
  return _id_00;
}

Assistant:

int QItemSelectionModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 25)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 25;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 25)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 25;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}